

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

void read_tx_size_vartx(MACROBLOCKD *xd,MB_MODE_INFO *mbmi,TX_SIZE tx_size,int depth,int blk_row,
                       int blk_col,aom_reader *r)

{
  aom_cdf_prob *paVar1;
  BLOCK_SIZE BVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  FRAME_CONTEXT *pFVar10;
  short sVar11;
  bool bVar12;
  byte bVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  int idx;
  int iVar20;
  aom_cdf_prob (*icdf) [3];
  byte bVar21;
  TX_SIZE TVar22;
  uint uVar23;
  uint uVar24;
  int idy;
  int iVar25;
  int idx_1;
  ulong uVar26;
  TXFM_CONTEXT *__s;
  int col;
  
  BVar2 = mbmi->bsize;
  bVar19 = block_size_high[BVar2];
  uVar23 = (uint)bVar19;
  if (xd->mb_to_bottom_edge < 0) {
    uVar23 = (xd->mb_to_bottom_edge >> ((char)xd->plane[0].subsampling_y + 3U & 0x1f)) + uVar23;
  }
  bVar21 = block_size_wide[BVar2];
  uVar24 = (uint)bVar21;
  if (xd->mb_to_right_edge < 0) {
    uVar24 = (xd->mb_to_right_edge >> ((char)xd->plane[0].subsampling_x + 3U & 0x1f)) + (uint)bVar21
    ;
  }
  if ((int)uVar23 >> 2 <= blk_row) {
    return;
  }
  if ((int)uVar24 >> 2 <= blk_col) {
    return;
  }
  bVar3 = ""[""[BVar2]];
  bVar13 = (char)tx_size_wide_log2[bVar3] - 2;
  bVar17 = (char)tx_size_high_log2[bVar3] - 2;
  bVar18 = ""[BVar2] - bVar13;
  if (depth == 2) {
    uVar15 = (ulong)((uint)tx_size * 4);
    iVar14 = *(int *)((long)tx_size_high_unit + uVar15);
    iVar7 = *(int *)((long)tx_size_wide_unit + uVar15);
    iVar8 = *(int *)((long)tx_size_high_unit + (ulong)((uint)bVar3 * 4));
    iVar9 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)bVar3 * 4));
    iVar25 = 0;
    do {
      iVar20 = 0;
      do {
        mbmi->inter_tx_size
        [(blk_col + iVar20 >> (bVar13 & 0x1f)) +
         ((iVar25 + blk_row >> (bVar17 & 0x1f)) << (bVar18 & 0x1f))] = tx_size;
        iVar20 = iVar20 + iVar9;
      } while (iVar20 < iVar7);
      iVar25 = iVar25 + iVar8;
    } while (iVar25 < iVar14);
    mbmi->tx_size = tx_size;
    __s = xd->above_txfm_context + blk_col;
    bVar19 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
             [txsize_to_bsize[tx_size]];
    uVar23 = *(uint *)((long)tx_size_wide + uVar15);
    memset(xd->left_txfm_context + blk_row,*(int *)((long)tx_size_high + uVar15),
           (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [txsize_to_bsize[tx_size]] +
                   (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [txsize_to_bsize[tx_size]] == 0) & 0xff));
    uVar24 = (uint)bVar19 + (uint)(bVar19 == 0);
    goto LAB_00170d9a;
  }
  uVar26 = (ulong)tx_size;
  uVar15 = (ulong)((uint)tx_size * 4);
  uVar23 = (uint)*(byte *)((long)tx_size_wide + uVar15);
  bVar4 = *(byte *)((long)tx_size_high + uVar15);
  pFVar10 = xd->tile_ctx;
  if (tx_size == '\0') {
    lVar16 = 0;
  }
  else {
    if (bVar19 < bVar21) {
      bVar19 = bVar21;
    }
    bVar21 = 1;
    if (bVar19 < 0x20) {
      if (bVar19 == 8) {
        TVar22 = '\x01';
        bVar12 = false;
        bVar21 = 0;
      }
      else {
        if (bVar19 != 0x10) goto LAB_00170a4b;
        TVar22 = '\x02';
LAB_00170a3c:
        bVar12 = false;
      }
    }
    else {
      TVar22 = '\x04';
      bVar12 = false;
      if ((bVar19 != 0x80) && (bVar19 != 0x40)) {
        if (bVar19 == 0x20) {
          TVar22 = '\x03';
          goto LAB_00170a3c;
        }
LAB_00170a4b:
        bVar12 = true;
        TVar22 = '\0';
        bVar21 = 1;
      }
    }
    lVar16 = 0x3f;
    if (!bVar12) {
      lVar16 = (ulong)(byte)((bVar21 & ""[uVar26] != TVar22) + TVar22 * -2 + 8) * 3;
    }
    lVar16 = (ulong)((uint)xd->left_txfm_context[blk_row] < (uint)bVar4) +
             (ulong)(xd->above_txfm_context[blk_col] < uVar23) + lVar16;
  }
  icdf = pFVar10->txfm_partition_cdf + lVar16;
  iVar14 = od_ec_decode_cdf_q15(&r->ec,*icdf,2);
  if (r->allow_update_cdf != '\0') {
    uVar5 = pFVar10->txfm_partition_cdf[lVar16][2];
    bVar19 = (char)(uVar5 >> 4) + 4;
    uVar6 = (*icdf)[0];
    if ((char)iVar14 < '\x01') {
      sVar11 = -(uVar6 >> (bVar19 & 0x1f));
    }
    else {
      sVar11 = (short)((int)(0x8000 - (uint)uVar6) >> (bVar19 & 0x1f));
    }
    (*icdf)[0] = sVar11 + uVar6;
    paVar1 = pFVar10->txfm_partition_cdf[lVar16] + 2;
    *paVar1 = *paVar1 + (ushort)(uVar5 < 0x20);
  }
  if (iVar14 == 0) {
    iVar14 = *(int *)((long)tx_size_high_unit + uVar15);
    iVar7 = *(int *)((long)tx_size_wide_unit + uVar15);
    iVar8 = *(int *)((long)tx_size_high_unit + (ulong)((uint)bVar3 * 4));
    iVar9 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)bVar3 * 4));
    iVar25 = 0;
    do {
      iVar20 = 0;
      do {
        mbmi->inter_tx_size
        [(blk_col + iVar20 >> (bVar13 & 0x1f)) +
         ((iVar25 + blk_row >> (bVar17 & 0x1f)) << (bVar18 & 0x1f))] = tx_size;
        iVar20 = iVar20 + iVar9;
      } while (iVar20 < iVar7);
      iVar25 = iVar25 + iVar8;
    } while (iVar25 < iVar14);
    mbmi->tx_size = tx_size;
    __s = xd->above_txfm_context + blk_col;
    bVar19 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
             [txsize_to_bsize[uVar26]];
    memset(xd->left_txfm_context + blk_row,(uint)bVar4,
           (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [txsize_to_bsize[uVar26]] +
                   (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [txsize_to_bsize[uVar26]] == 0) & 0xff));
    uVar24 = (uint)bVar19 + (uint)(bVar19 == 0);
  }
  else {
    bVar19 = ""[uVar26];
    if ((99UL >> (uVar26 & 0x3f) & 1) == 0) {
      iVar14 = tx_size_wide_unit[bVar19];
      iVar7 = tx_size_high_unit[bVar19];
      iVar8 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
      iVar9 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
      iVar25 = 0;
      do {
        iVar20 = 0;
        do {
          read_tx_size_vartx(xd,mbmi,bVar19,depth + 1,iVar25 + blk_row,blk_col + iVar20,r);
          iVar20 = iVar20 + iVar14;
        } while (iVar20 < iVar9);
        iVar25 = iVar25 + iVar7;
      } while (iVar25 < iVar8);
      return;
    }
    iVar14 = *(int *)((long)tx_size_high_unit + uVar15);
    iVar7 = *(int *)((long)tx_size_wide_unit + uVar15);
    iVar8 = *(int *)((long)tx_size_high_unit + (ulong)((uint)bVar3 * 4));
    iVar9 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)bVar3 * 4));
    iVar25 = 0;
    do {
      iVar20 = 0;
      do {
        mbmi->inter_tx_size
        [(blk_col + iVar20 >> (bVar13 & 0x1f)) +
         ((iVar25 + blk_row >> (bVar17 & 0x1f)) << (bVar18 & 0x1f))] = '\0';
        iVar20 = iVar20 + iVar9;
      } while (iVar20 < iVar7);
      iVar25 = iVar25 + iVar8;
    } while (iVar25 < iVar14);
    mbmi->tx_size = bVar19;
    __s = xd->above_txfm_context + blk_col;
    bVar21 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
             [txsize_to_bsize[uVar26]];
    uVar23 = tx_size_wide[bVar19];
    memset(xd->left_txfm_context + blk_row,tx_size_high[bVar19],
           (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [txsize_to_bsize[uVar26]] +
                   (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [txsize_to_bsize[uVar26]] == 0) & 0xff));
    uVar24 = (uint)bVar21 + (uint)(bVar21 == 0);
  }
LAB_00170d9a:
  memset(__s,uVar23,(ulong)(uVar24 & 0xff));
  return;
}

Assistant:

static inline void read_tx_size_vartx(MACROBLOCKD *xd, MB_MODE_INFO *mbmi,
                                      TX_SIZE tx_size, int depth, int blk_row,
                                      int blk_col, aom_reader *r) {
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  int is_split = 0;
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int max_blocks_high = max_block_high(xd, bsize, 0);
  const int max_blocks_wide = max_block_wide(xd, bsize, 0);
  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;
  assert(tx_size > TX_4X4);
  TX_SIZE txs = max_txsize_rect_lookup[bsize];
  for (int level = 0; level < MAX_VARTX_DEPTH - 1; ++level)
    txs = sub_tx_size_map[txs];
  const int tx_w_log2 = tx_size_wide_log2[txs] - MI_SIZE_LOG2;
  const int tx_h_log2 = tx_size_high_log2[txs] - MI_SIZE_LOG2;
  const int bw_log2 = mi_size_wide_log2[bsize];
  const int stride_log2 = bw_log2 - tx_w_log2;

  if (depth == MAX_VARTX_DEPTH) {
    set_inter_tx_size(mbmi, stride_log2, tx_w_log2, tx_h_log2, txs, tx_size,
                      tx_size, blk_row, blk_col);
    mbmi->tx_size = tx_size;
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
    return;
  }

  const int ctx = txfm_partition_context(xd->above_txfm_context + blk_col,
                                         xd->left_txfm_context + blk_row,
                                         mbmi->bsize, tx_size);
  is_split = aom_read_symbol(r, ec_ctx->txfm_partition_cdf[ctx], 2, ACCT_STR);

  if (is_split) {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];

    if (sub_txs == TX_4X4) {
      set_inter_tx_size(mbmi, stride_log2, tx_w_log2, tx_h_log2, txs, tx_size,
                        sub_txs, blk_row, blk_col);
      mbmi->tx_size = sub_txs;
      txfm_partition_update(xd->above_txfm_context + blk_col,
                            xd->left_txfm_context + blk_row, sub_txs, tx_size);
      return;
    }

    assert(bsw > 0 && bsh > 0);
    for (int row = 0; row < tx_size_high_unit[tx_size]; row += bsh) {
      for (int col = 0; col < tx_size_wide_unit[tx_size]; col += bsw) {
        int offsetr = blk_row + row;
        int offsetc = blk_col + col;
        read_tx_size_vartx(xd, mbmi, sub_txs, depth + 1, offsetr, offsetc, r);
      }
    }
  } else {
    set_inter_tx_size(mbmi, stride_log2, tx_w_log2, tx_h_log2, txs, tx_size,
                      tx_size, blk_row, blk_col);
    mbmi->tx_size = tx_size;
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
  }
}